

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,ForStmt *node)

{
  SemanticContext *pSVar1;
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *this_00;
  PosPair PVar2;
  bool bVar3;
  ASTNode *pAVar4;
  mapped_type *rhs;
  IncompatibleTypes *this_01;
  mapped_type *pmVar5;
  shared_ptr<mocker::ast::Type> local_138;
  ScopeID local_128;
  shared_ptr<mocker::ast::ASTNode> local_110;
  undefined1 local_100 [8];
  ScopeID scopeIntroduced;
  shared_ptr<mocker::ast::ASTNode> local_d0;
  NodeID local_c0;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  size_t sStack_a0;
  NodeID local_90;
  shared_ptr<mocker::ast::Type> local_88;
  ScopeID local_78;
  shared_ptr<mocker::ast::ASTNode> local_60 [2];
  ScopeID local_40;
  shared_ptr<mocker::ast::ASTNode> local_28;
  ForStmt *local_18;
  ForStmt *node_local;
  Annotator *this_local;
  
  local_18 = node;
  node_local = (ForStmt *)this;
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->init);
  if (bVar3) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_28,&local_18->init);
    ScopeID::ScopeID(&local_40,&this->scopeResiding);
    visit(this,&local_28,&local_40);
    ScopeID::~ScopeID(&local_40);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->condition);
  if (bVar3) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (local_60,&local_18->condition);
    ScopeID::ScopeID(&local_78,&this->scopeResiding);
    visit(this,local_60,&local_78);
    ScopeID::~ScopeID(&local_78);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(local_60);
    std::shared_ptr<mocker::ast::Type>::shared_ptr<mocker::ast::BuiltinType,void>
              (&local_88,&this->builtinBool);
    pSVar1 = this->ctx;
    pAVar4 = &std::
              __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_18->condition)->super_ASTNode;
    local_90 = ast::ASTNode::getID(pAVar4);
    rhs = std::
          unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
          ::operator[](&pSVar1->exprType,&local_90);
    bVar3 = assignable(this,&local_88,rhs);
    std::shared_ptr<mocker::ast::Type>::~shared_ptr(&local_88);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      this_01 = (IncompatibleTypes *)__cxa_allocate_exception(0x48);
      this_00 = this->pos;
      pAVar4 = &std::
                __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&local_18->condition)->super_ASTNode;
      local_c0 = ast::ASTNode::getID(pAVar4);
      pmVar5 = std::
               unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
               ::at(this_00,&local_c0);
      local_b8 = (pmVar5->first).line;
      sStack_b0 = (pmVar5->first).col;
      local_a8 = (pmVar5->second).line;
      sStack_a0 = (pmVar5->second).col;
      PVar2.first = pmVar5->first;
      PVar2.second = pmVar5->second;
      IncompatibleTypes::CompileError(this_01,PVar2);
      __cxa_throw(this_01,&IncompatibleTypes::typeinfo,IncompatibleTypes::~IncompatibleTypes);
    }
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_18->update);
  if (bVar3) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
              (&local_d0,&local_18->update);
    ScopeID::ScopeID((ScopeID *)
                     &scopeIntroduced.ids.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&this->scopeResiding);
    visit(this,&local_d0,
          (ScopeID *)
          &scopeIntroduced.ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
    ScopeID::~ScopeID((ScopeID *)
                      &scopeIntroduced.ids.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_d0);
  }
  SymTbl::createSubscope((ScopeID *)local_100,&this->ctx->syms,&this->scopeResiding);
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
            (&local_110,&local_18->body);
  ScopeID::ScopeID(&local_128,(ScopeID *)local_100);
  bVar3 = this->inFunc;
  std::shared_ptr<mocker::ast::Type>::shared_ptr(&local_138,&this->retType);
  visit(this,&local_110,&local_128,true,(bool)(bVar3 & 1),&local_138);
  std::shared_ptr<mocker::ast::Type>::~shared_ptr(&local_138);
  ScopeID::~ScopeID(&local_128);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_110);
  ScopeID::~ScopeID((ScopeID *)local_100);
  return;
}

Assistant:

void operator()(ast::ForStmt &node) const override {
    if (node.init)
      visit(node.init, scopeResiding);
    if (node.condition) {
      visit(node.condition, scopeResiding);
      if (!assignable(builtinBool, ctx.exprType[node.condition->getID()]))
        throw IncompatibleTypes(pos.at(node.condition->getID()));
    }
    if (node.update)
      visit(node.update, scopeResiding);

    auto scopeIntroduced = ctx.syms.createSubscope(scopeResiding);
    visit(node.body, scopeIntroduced, true, inFunc, retType);
  }